

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loader_host.c
# Opt level: O1

plugin loader_host_initialize(void)

{
  int iVar1;
  loader_impl impl;
  char *pcVar2;
  type_conflict t;
  plugin ppVar3;
  int iVar4;
  int id;
  
  impl = loader_impl_create_host("__metacall_host__");
  ppVar3 = (plugin)0x0;
  if (impl != (loader_impl)0x0) {
    do {
      id = (int)ppVar3;
      pcVar2 = type_id_name(id);
      t = type_create(id,pcVar2,(type_impl)0x0,(type_impl_interface_singleton)0x0);
      iVar4 = 0;
      if (t != (type_conflict)0x0) {
        pcVar2 = type_name(t);
        iVar1 = loader_impl_type_define(impl,pcVar2,t);
        iVar4 = 0;
        if (iVar1 != 0) {
          type_destroy(t);
          iVar4 = 5;
        }
      }
      if (iVar4 != 0) {
        if (iVar4 != 5) {
          return ppVar3;
        }
        goto LAB_001247e5;
      }
      ppVar3 = (plugin)(ulong)(id + 1U);
    } while (id + 1U != 0x13);
    ppVar3 = plugin_create("__metacall_host__",(plugin_descriptor)0x0,(void *)0x0,impl,
                           loader_host_destroy_dtor);
    if (ppVar3 == (plugin)0x0) {
LAB_001247e5:
      loader_impl_destroy_objects(impl);
      loader_impl_destroy_deallocate(impl);
      ppVar3 = (plugin)0x0;
    }
  }
  return ppVar3;
}

Assistant:

plugin loader_host_initialize(void)
{
	static const loader_tag tag = LOADER_HOST_NAME;
	loader_impl host = loader_impl_create_host(tag);
	type_id id;

	if (host == NULL)
	{
		return NULL;
	}

	for (id = 0; id < TYPE_SIZE; ++id)
	{
		type t = type_create(id, type_id_name(id), NULL, NULL);

		if (t != NULL)
		{
			if (loader_impl_type_define(host, type_name(t), t) != 0)
			{
				type_destroy(t);
				goto error;
			}
		}
	}

	plugin p = plugin_create(LOADER_HOST_NAME, NULL, NULL, host, &loader_host_destroy_dtor);

	if (p == NULL)
	{
		goto error;
	}

	return p;
error:
	loader_host_destroy(host);
	return NULL;
}